

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmHexFileConverter.cxx
# Opt level: O0

bool cmHexFileConverter::TryConvert(string *inFileName,string *outFileName)

{
  FileType FVar1;
  FILE *__stream;
  FILE *__stream_00;
  char *pcVar2;
  char local_448 [8];
  char buf [1024];
  bool local_39;
  bool success;
  FILE *outFile;
  FILE *inFile;
  FileType type;
  string *outFileName_local;
  string *inFileName_local;
  
  FVar1 = DetermineFileType(inFileName);
  if (FVar1 == Binary) {
    inFileName_local._7_1_ = false;
  }
  else {
    __stream = (FILE *)cmsys::SystemTools::Fopen(inFileName,"rb");
    __stream_00 = (FILE *)cmsys::SystemTools::Fopen(outFileName,"wb");
    if ((__stream == (FILE *)0x0) || (__stream_00 == (FILE *)0x0)) {
      if (__stream != (FILE *)0x0) {
        fclose(__stream);
      }
      if (__stream_00 != (FILE *)0x0) {
        fclose(__stream_00);
      }
      inFileName_local._7_1_ = false;
    }
    else {
      local_39 = false;
      do {
        pcVar2 = fgets(local_448,0x400,__stream);
        if (pcVar2 == (char *)0x0) break;
        if (FVar1 == MotorolaSrec) {
          local_39 = ConvertMotorolaSrecLine(local_448,(FILE *)__stream_00);
        }
        else if (FVar1 == IntelHex) {
          local_39 = ConvertIntelHexLine(local_448,(FILE *)__stream_00);
        }
      } while (local_39 != false);
      fclose(__stream);
      fclose(__stream_00);
      inFileName_local._7_1_ = local_39;
    }
  }
  return inFileName_local._7_1_;
}

Assistant:

bool cmHexFileConverter::TryConvert(const std::string& inFileName,
                                    const std::string& outFileName)
{
  FileType type = DetermineFileType(inFileName);
  if (type == Binary) {
    return false;
  }

  // try to open the file
  FILE* inFile = cmsys::SystemTools::Fopen(inFileName, "rb");
  FILE* outFile = cmsys::SystemTools::Fopen(outFileName, "wb");
  if ((inFile == nullptr) || (outFile == nullptr)) {
    if (inFile != nullptr) {
      fclose(inFile);
    }
    if (outFile != nullptr) {
      fclose(outFile);
    }
    return false;
  }

  // convert them line by line
  bool success = false;
  char buf[1024];
  while (fgets(buf, 1024, inFile) != nullptr) {
    if (type == MotorolaSrec) {
      success = ConvertMotorolaSrecLine(buf, outFile);
    } else if (type == IntelHex) {
      success = ConvertIntelHexLine(buf, outFile);
    }
    if (!success) {
      break;
    }
  }

  // close them again
  fclose(inFile);
  fclose(outFile);
  return success;
}